

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

type __thiscall
chrono::ChFunctorArchiveInSpecificPtr<chrono::ChFunctionPosition>::
_constructor<chrono::ChFunctionPosition>
          (ChFunctorArchiveInSpecificPtr<chrono::ChFunctionPosition> *this,ChArchiveIn *marchive,
          char *classname)

{
  ChExceptionArchive *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,
             "Cannot call CallConstructor() for an object without default constructor.",&local_39);
  ChExceptionArchive::ChExceptionArchive(this_00,&local_38);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

typename enable_if< !std::is_default_constructible<Tc>::value, void >::type
        _constructor(ChArchiveIn& marchive, const char* classname) {
            throw (ChExceptionArchive( "Cannot call CallConstructor() for an object without default constructor.")); 
        }